

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void prvTidyAccessibilityChecks(TidyDocImpl *doc)

{
  tmbchar *__haystack;
  long lVar1;
  int iVar2;
  uint uVar3;
  Lexer *pLVar4;
  Bool BVar5;
  Node *pNVar6;
  char *pcVar7;
  ulong uVar8;
  char *node;
  
  iVar2 = *(int *)((doc->config).value + 1);
  memset(&doc->access,0,0x148);
  (doc->access).PRIORITYCHK = iVar2;
  prvTidyDialogue(doc,0x1fa);
  CheckScriptKeyboardAccessible(doc,&doc->root);
  node = (char *)doc;
  CheckForStyleAttribute(doc,&doc->root);
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto LAB_001506b4;
  pNVar6 = prvTidyFindDocType(doc);
  if (pNVar6 != (Node *)0x0) {
    if (pNVar6->end == 0) goto LAB_001506b4;
    __haystack = (doc->access).text;
    uVar3 = pNVar6->start;
    if (uVar3 < pNVar6->end) {
      pLVar4 = doc->lexer;
      uVar8 = 0;
      do {
        __haystack[uVar8] = pLVar4->lexbuf[uVar8 + uVar3];
        if (uVar8 == 0x7f) {
          uVar8 = 0x7f;
          break;
        }
        lVar1 = uVar3 + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar1 + 1U < (ulong)pNVar6->end);
      uVar8 = uVar8 & 0xffffffff;
    }
    else {
      uVar8 = 0;
    }
    (doc->access).text[uVar8] = '\0';
    BVar5 = prvTidyIsHTML5Mode(doc);
    if (BVar5 == no) {
      node = "HTML PUBLIC";
      pcVar7 = strstr(__haystack,"HTML PUBLIC");
      if (pcVar7 != (char *)0x0) goto LAB_001506b4;
      node = "html PUBLIC";
    }
    else {
      node = "HTML";
      pcVar7 = strstr(__haystack,"HTML");
      if (pcVar7 != (char *)0x0) goto LAB_001506b4;
      node = "html";
    }
    pcVar7 = strstr(__haystack,node);
    if (pcVar7 != (char *)0x0) goto LAB_001506b4;
  }
  node = (char *)doc;
  prvTidyReportAccessError(doc,&doc->root,0x2b6);
LAB_001506b4:
  if ((((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) &&
     (BVar5 = CheckMissingStyleSheets(doc,(Node *)node), BVar5 == no)) {
    prvTidyReportAccessError(doc,&doc->root,0x2b7);
  }
  CheckForListElements(doc,&doc->root);
  AccessibilityCheckNode(doc,&doc->root);
  return;
}

Assistant:

void TY_(AccessibilityChecks)( TidyDocImpl* doc )
{
    /* Initialize */
    InitAccessibilityChecks( doc, cfg(doc, TidyAccessibilityCheckLevel) );

    /* Hello there, ladies and gentlemen... */
    TY_(Dialogue)( doc, STRING_HELLO_ACCESS );

    /* Checks all elements for script accessibility */
    CheckScriptKeyboardAccessible( doc, &doc->root );

    /* Checks entire document for the use of 'STYLE' attribute */
    CheckForStyleAttribute( doc, &doc->root );

    /* Checks for '!DOCTYPE' */
    CheckDocType( doc );

    
    /* Checks to see if stylesheets are used to control the layout */
    if ( Level2_Enabled( doc )
         && ! CheckMissingStyleSheets( doc, &doc->root ) )
    {
        TY_(ReportAccessError)( doc, &doc->root, STYLE_SHEET_CONTROL_PRESENTATION );
    }

    /* Check to see if any list elements are found within the document */
    CheckForListElements( doc, &doc->root );

    /* Recursively apply all remaining checks to 
    ** each node in document.
    */
    AccessibilityCheckNode( doc, &doc->root );

    /* Cleanup */
    FreeAccessibilityChecks( doc );
}